

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void * Acb_VerilogSimpleParse(Vec_Int_t *vBuffer,Abc_Nam_t *pNames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  char *pcVar8;
  Ndr_Data_t *p_01;
  uchar *puVar9;
  uint *puVar10;
  int *piVar11;
  Vec_Int_t *pVVar12;
  int unaff_EBP;
  Vec_Int_t *p_02;
  int iVar13;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int local_6c;
  Vec_Int_t *pVVar14;
  Vec_Int_t *p_03;
  int Output;
  
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  pVVar5 = Vec_IntAlloc(100);
  pVVar6 = Vec_IntAlloc(100);
  pVVar7 = Vec_IntAlloc(100);
  iVar1 = Vec_IntEntry(vBuffer,0);
  if (iVar1 != 1) {
    __assert_fail("Vec_IntEntry(vBuffer, 0) == ACB_MODULE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0xda,"void *Acb_VerilogSimpleParse(Vec_Int_t *, Abc_Nam_t *)");
  }
  pVVar12 = (Vec_Int_t *)0x0;
  iVar1 = 2;
  p_02 = pVVar5;
  p_03 = pVVar7;
  while (iVar1 < vBuffer->nSize) {
    unaff_EBP = Vec_IntEntry(vBuffer,iVar1);
    iVar13 = iVar1;
    pVVar14 = pVVar6;
    if ((pVVar12 == (Vec_Int_t *)0x0) && (0xd < unaff_EBP)) {
      pVVar12 = (Vec_Int_t *)0x0;
    }
    else {
      switch(unaff_EBP) {
      case 2:
        goto switchD_003078e1_caseD_2;
      case 3:
        pVVar12 = p;
        break;
      case 4:
        pVVar12 = p_00;
        break;
      case 5:
        pVVar12 = pVVar5;
        break;
      default:
        if (unaff_EBP - 6U < 8) {
          iVar2 = Vec_IntEntry(vBuffer,iVar1 + 1);
          pcVar8 = Abc_NamStr(pNames,iVar2);
          pVVar14 = pVVar6;
          Vec_IntPush(pVVar6,unaff_EBP);
          pVVar5 = p_02;
          Vec_IntPush(pVVar6,pVVar7->nSize);
          pVVar12 = pVVar7;
          p_02 = pVVar5;
          if ((((pcVar8[1] == 'z') && (pVVar12 = p_03, pVVar7 = p_03, pcVar8[2] == '_')) &&
              (pcVar8[3] == 'g')) && (iVar13 = iVar1 + 1, pcVar8[4] != '_')) {
            iVar13 = iVar1;
          }
        }
        else {
          Vec_IntPush(pVVar12,unaff_EBP);
          pVVar14 = pVVar6;
        }
      }
    }
    pVVar6 = pVVar14;
    iVar1 = iVar13 + 1;
  }
switchD_003078e1_caseD_2:
  local_6c = unaff_EBP;
  pVVar5 = pVVar6;
  Vec_IntPush(pVVar6,-1);
  Vec_IntPush(pVVar6,pVVar7->nSize);
  uVar3 = Vec_IntEntry(vBuffer,1);
  p_01 = (Ndr_Data_t *)malloc(0x18);
  p_01->nCap = 0x10;
  puVar9 = (uchar *)malloc(0x10);
  p_01->pHead = puVar9;
  puVar10 = (uint *)malloc(0x100);
  p_01->pBody = puVar10;
  *puVar10 = 0;
  *puVar9 = '\x01';
  puVar9[1] = '\a';
  p_01->nSize = 2;
  puVar10[1] = uVar3;
  Ndr_DataAddTo(p_01,0,2);
  if (uVar3 == 0) {
    __assert_fail("Name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                  ,0x20d,"void *Ndr_Create(int)");
  }
  iVar13 = 1;
  uVar3 = Vec_IntEntry(vBuffer,1);
  Ndr_DataResize(p_01,6);
  puVar9 = p_01->pHead;
  iVar1 = p_01->nSize;
  puVar9[iVar1] = '\x02';
  puVar10 = p_01->pBody;
  puVar10[iVar1] = 0;
  puVar9[(long)iVar1 + 1] = '\a';
  p_01->nSize = iVar1 + 2U;
  puVar10[(long)iVar1 + 1] = uVar3;
  Ndr_DataAddTo(p_01,2,iVar1);
  iVar2 = 0;
  Ndr_DataAddTo(p_01,0,iVar1);
  if (*puVar10 != iVar1 + 2U) {
    __assert_fail("(int)p->pBody[0] == p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                  ,0x21c,"int Ndr_AddModule(void *, int)");
  }
  Ndr_DataResize(p_01,p->nSize);
  pVVar7 = p_02;
  for (; iVar2 < p->nSize; iVar2 = iVar2 + 1) {
    uVar3 = Vec_IntEntry(p,iVar2);
    iVar1 = p_01->nSize;
    p_01->pHead[iVar1] = '\x04';
    p_01->nSize = iVar1 + 1;
    p_01->pBody[iVar1] = uVar3;
  }
  Ndr_DataAddTo(p_01,2,p->nSize);
  Ndr_DataAddTo(p_01,0,p->nSize);
  Ndr_DataResize(p_01,p_00->nSize);
  for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    uVar3 = Vec_IntEntry(p_00,iVar1);
    iVar2 = p_01->nSize;
    p_01->pHead[iVar2] = '\x05';
    p_01->nSize = iVar2 + 1;
    p_01->pBody[iVar2] = uVar3;
  }
  Ndr_DataAddTo(p_01,2,p_00->nSize);
  iVar1 = 0;
  Ndr_DataAddTo(p_01,0,p_00->nSize);
  Ndr_DataResize(p_01,p_02->nSize);
  for (iVar2 = 0; iVar2 < p_02->nSize; iVar2 = iVar2 + 1) {
    uVar3 = Vec_IntEntry(p_02,iVar2);
    p_02 = pVVar7;
    iVar4 = Acb_WireIsTarget(uVar3,pNames);
    if (iVar4 != 0) {
      iVar4 = p_01->nSize;
      p_01->pHead[iVar4] = '\n';
      p_01->nSize = iVar4 + 1;
      p_01->pBody[iVar4] = uVar3;
      iVar1 = iVar1 + 1;
    }
    pVVar7 = p_02;
  }
  Ndr_DataAddTo(p_01,2,iVar1);
  Ndr_DataAddTo(p_01,0,iVar1);
  for (iVar1 = 0; iVar2 = (int)pNames, iVar1 < p->nSize; iVar1 = iVar1 + 1) {
    local_6c = Vec_IntEntry(p,iVar1);
    Ndr_AddObject(p_01,0x102,3,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar7->nCap,iVar2,&pVVar5->nCap,(char *)p_03);
  }
  local_6c = Abc_NamStrFind(pNames,"1\'b0");
  if (local_6c != 0) {
    Ndr_AddObject(p_01,0x102,7,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar7->nCap,iVar2,&pVVar5->nCap,(char *)p_03);
  }
  local_6c = Abc_NamStrFind(pNames,"1\'b1");
  pVVar6 = pVVar5;
  if (local_6c != 0) {
    Ndr_AddObject(p_01,0x102,8,0,0,(int)&local_6c,in_stack_ffffffffffffff88,
                  in_stack_ffffffffffffff90,&pVVar7->nCap,iVar2,&pVVar5->nCap,(char *)p_03);
  }
  iVar1 = pVVar5->nSize;
  pVVar12 = p_03;
  do {
    if (iVar1 <= iVar13) {
      for (iVar13 = 0; iVar13 < p_00->nSize; iVar13 = iVar13 + 1) {
        local_6c = Vec_IntEntry(p_00,iVar13);
        Ndr_AddObject(p_01,0x102,4,1,(int)&local_6c,(int)&local_6c,in_stack_ffffffffffffff88,
                      in_stack_ffffffffffffff90,&pVVar7->nCap,iVar1,&pVVar6->nCap,(char *)pVVar12);
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
      Vec_IntFree(pVVar7);
      Vec_IntFree(pVVar6);
      Vec_IntFree(pVVar12);
      return p_01;
    }
    iVar2 = Vec_IntEntry(pVVar5,iVar13 + -1);
    uVar3 = Vec_IntEntry(pVVar5,iVar13);
    if (0 < iVar2) {
      Output = Vec_IntEntry(p_03,uVar3);
      iVar4 = Vec_IntEntry(pVVar5,iVar13 + 2);
      piVar11 = Vec_IntEntryP(p_03,uVar3 + 1);
      if (7 < iVar2 - 6U) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                      ,0x54,"int Acb_Type2Oper(int)");
      }
      pVVar5 = pVVar6;
      Ndr_AddObject(p_01,0x102,iVar2 + 5,iVar4 + ~uVar3,(int)piVar11,(int)&Output,
                    in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,&pVVar7->nCap,iVar1,
                    &pVVar6->nCap,(char *)pVVar12);
      pVVar6 = pVVar5;
    }
    iVar13 = iVar13 + 2;
  } while( true );
}

Assistant:

void * Acb_VerilogSimpleParse( Vec_Int_t * vBuffer, Abc_Nam_t * pNames )
{
    Ndr_Data_t * pDesign = NULL;
    Vec_Int_t * vInputs  = Vec_IntAlloc(100);
    Vec_Int_t * vOutputs = Vec_IntAlloc(100);
    Vec_Int_t * vWires   = Vec_IntAlloc(100);
    Vec_Int_t * vTypes   = Vec_IntAlloc(100);
    Vec_Int_t * vFanins  = Vec_IntAlloc(100);
    Vec_Int_t * vCur     = NULL;  
    int i, ModuleID, Token, Size, Count = 0;
    assert( Vec_IntEntry(vBuffer, 0) == ACB_MODULE );
    Vec_IntForEachEntryStart( vBuffer, Token, i, 2 )
    {
        if ( vCur == NULL && Token >= ACB_UNUSED )
            continue;
        if ( Token == ACB_ENDMODULE )
            break;
        if ( Token == ACB_INPUT )
            vCur = vInputs;
        else if ( Token == ACB_OUTPUT )
            vCur = vOutputs;
        else if ( Token == ACB_WIRE )
            vCur = vWires;
        else if ( Token >= ACB_BUF && Token <= ACB_XNOR )
        {
            char * pToken = Abc_NamStr(pNames, Vec_IntEntry(vBuffer, i+1));
            Vec_IntPush( vTypes, Token );
            Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
            vCur = vFanins;
            if ( pToken[1] == 'z' && pToken[2] == '_' && pToken[3] == 'g' && pToken[4] == '_' )
                i++;
        }
        else 
            Vec_IntPush( vCur, Token );
    }
    Vec_IntPush( vTypes, -1 );
    Vec_IntPush( vTypes, Vec_IntSize(vFanins) );
    // create design
    pDesign = Ndr_Create( Vec_IntEntry(vBuffer, 1) );
    ModuleID = Ndr_AddModule( pDesign, Vec_IntEntry(vBuffer, 1) );
    // create inputs
    Ndr_DataResize( pDesign, Vec_IntSize(vInputs) );
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_DataPush( pDesign, NDR_INPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vInputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vInputs) );
    // create outputs
    Ndr_DataResize( pDesign, Vec_IntSize(vOutputs) );
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_DataPush( pDesign, NDR_OUTPUT, Token );
    Ndr_DataAddTo( pDesign, ModuleID-256, Vec_IntSize(vOutputs) );
    Ndr_DataAddTo( pDesign, 0, Vec_IntSize(vOutputs) );
    // create targets
    Ndr_DataResize( pDesign, Vec_IntSize(vWires) );
    Vec_IntForEachEntry( vWires, Token, i )
        if ( Acb_WireIsTarget(Token, pNames) )
            Ndr_DataPush( pDesign, NDR_TARGET, Token ), Count++;
    Ndr_DataAddTo( pDesign, ModuleID-256, Count );
    Ndr_DataAddTo( pDesign, 0, Count );
    // create nodes
    Vec_IntForEachEntry( vInputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CI, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b0")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_F, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    if ( (Token = Abc_NamStrFind(pNames, "1\'b1")) )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CONST_T, 0, 0, 0, 0,   0, NULL,  1, &Token,   NULL  ); // no fanins
    Vec_IntForEachEntryDouble( vTypes, Token, Size, i ) 
        if ( Token > 0 )
        {
            int Output = Vec_IntEntry(vFanins, Size);
            int nFanins = Vec_IntEntry(vTypes, i+3) - Size - 1;
            int * pFanins = Vec_IntEntryP(vFanins, Size+1);
            Ndr_AddObject( pDesign, ModuleID, Acb_Type2Oper(Token), 0, 0, 0, 0, nFanins, pFanins, 1, &Output, NULL ); // many fanins
        }
    Vec_IntForEachEntry( vOutputs, Token, i )
        Ndr_AddObject( pDesign, ModuleID, ABC_OPER_CO, 0, 0, 0, 0,   1, &Token, 1, &Token,  NULL  ); // one fanin
    // cleanup
    Vec_IntFree( vInputs );
    Vec_IntFree( vOutputs );
    Vec_IntFree( vWires );
    Vec_IntFree( vTypes );
    Vec_IntFree( vFanins );
    return pDesign;
}